

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QImage * qvariant_cast<QImage>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  QMetaType *pQVar5;
  void *pvVar6;
  undefined8 *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage *t;
  QMetaType targetType;
  QImage *in_stack_ffffffffffffffa8;
  QImage *image;
  QImage *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  image = in_RDI;
  QVar4 = QMetaType::fromType<QImage>();
  QVariant::Private::type((Private *)in_RDI);
  bVar2 = operator==((QMetaType *)in_RDI,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    if ((in_RSI[3] & 1) == 0) {
      QImage::QImage(in_RDI,in_stack_ffffffffffffffa8);
    }
    else {
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x33fdfb);
      if (iVar3 == 1) {
        QVariant::PrivateShared::data((PrivateShared *)*in_RSI);
        QImage::QImage(in_RDI,in_stack_ffffffffffffffa8);
      }
      else {
        QVariant::Private::get<QImage>((Private *)0x33fe29);
        QImage::QImage(in_stack_ffffffffffffffc0,image);
      }
    }
  }
  else {
    (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(in_RDI);
    pQVar5 = (QMetaType *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x33fe83);
    QMetaType::convert(pQVar5,pvVar6,(QMetaType *)QVar4.d_ptr,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return image;
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}